

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Decoration __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::TranslateNonUniformDecoration
          (TGlslangToSpvTraverser *this,TQualifier *qualifier)

{
  Decoration DVar1;
  
  DVar1 = DecorationMax;
  if ((qualifier->field_0xc & 2) != 0) {
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_EXT_descriptor_indexing",Spv_1_5);
    spv::Builder::addCapability(&this->builder,CapabilityShaderNonUniform);
    DVar1 = DecorationNonUniform;
  }
  return DVar1;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateNonUniformDecoration(const glslang::TQualifier& qualifier)
{
    if (qualifier.isNonUniform()) {
        builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
        builder.addCapability(spv::CapabilityShaderNonUniformEXT);
        return spv::DecorationNonUniformEXT;
    } else
        return spv::DecorationMax;
}